

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.c
# Opt level: O2

int ThreadPoolAddPersistent(ThreadPool *tp,ThreadPoolJob *job,int *jobId)

{
  int iVar1;
  ThreadPoolJob *pTVar2;
  int iVar3;
  
  if (job == (ThreadPoolJob *)0x0 || tp == (ThreadPool *)0x0) {
    return 0x16;
  }
  if (jobId != (int *)0x0) {
    *jobId = 0x20000000;
  }
  pthread_mutex_lock((pthread_mutex_t *)tp);
  if (tp->totalThreads < (tp->attr).maxThreads) {
    CreateWorker(tp);
  }
  else {
    iVar3 = 0x20000000;
    if (tp->totalThreads == tp->persistentThreads + 1) goto LAB_001142b8;
  }
  pTVar2 = CreateThreadPoolJob(job,tp->lastJobId,tp);
  if (pTVar2 == (ThreadPoolJob *)0x0) {
    iVar3 = 0x20000000;
  }
  else {
    tp->persistentJob = pTVar2;
    pthread_cond_signal((pthread_cond_t *)&tp->condition);
    while (tp->persistentJob != (ThreadPoolJob *)0x0) {
      pthread_cond_wait((pthread_cond_t *)&tp->start_and_shutdown,(pthread_mutex_t *)tp);
    }
    iVar1 = tp->lastJobId;
    iVar3 = 0;
    tp->lastJobId = iVar1 + 1;
    if (jobId != (int *)0x0) {
      *jobId = iVar1;
    }
  }
LAB_001142b8:
  pthread_mutex_unlock((pthread_mutex_t *)tp);
  return iVar3;
}

Assistant:

int ThreadPoolAddPersistent(ThreadPool *tp, ThreadPoolJob *job, int *jobId)
{
	int ret = 0;
	int tempId = -1;
	ThreadPoolJob *temp = NULL;

	if (!tp || !job) {
		return EINVAL;
	}
	if (!jobId) {
		jobId = &tempId;
	}
	*jobId = INVALID_JOB_ID;

	ithread_mutex_lock(&tp->mutex);

	/* Create A worker if less than max threads running */
	if (tp->totalThreads < tp->attr.maxThreads) {
		CreateWorker(tp);
	} else {
		/* if there is more than one worker thread
		 * available then schedule job, otherwise fail */
		if (tp->totalThreads - tp->persistentThreads - 1 == 0) {
			ret = EMAXTHREADS;
			goto exit_function;
		}
	}
	temp = CreateThreadPoolJob(job, tp->lastJobId, tp);
	if (!temp) {
		ret = EOUTOFMEM;
		goto exit_function;
	}
	tp->persistentJob = temp;

	/* Notify a waiting thread */
	ithread_cond_signal(&tp->condition);

	/* wait until long job has been picked up */
	while (tp->persistentJob)
		ithread_cond_wait(&tp->start_and_shutdown, &tp->mutex);
	*jobId = tp->lastJobId++;

exit_function:
	ithread_mutex_unlock(&tp->mutex);

	return ret;
}